

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          TextGenerator *generator)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  _Base_ptr p_Var6;
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  *puVar7;
  Message *message_00;
  uint64 uVar8;
  int64 iVar9;
  string *this_00;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar10;
  long *plVar11;
  _Base_ptr p_Var12;
  _func_void_FieldDescriptor_ptr *p_Var13;
  undefined4 uVar14;
  string scratch;
  string truncated_value;
  string local_b0;
  FieldDescriptor *local_90 [2];
  FieldDescriptor local_80 [16];
  _func_void_FieldDescriptor_ptr *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  p_Var12 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var12 == (_Base_ptr)0x0) {
LAB_00372e05:
    puVar7 = &this->default_field_value_printer_;
  }
  else {
    p_Var1 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(FieldDescriptor **)(p_Var12 + 1) >= field) {
        p_Var6 = p_Var12;
      }
      p_Var12 = (&p_Var12->_M_left)[*(FieldDescriptor **)(p_Var12 + 1) < field];
    } while (p_Var12 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 == p_Var1) || (field < *(FieldDescriptor **)(p_Var6 + 1)))
    goto LAB_00372e05;
    puVar7 = (unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
              *)&p_Var6[1]._M_parent;
  }
  p_Var12 = (_Base_ptr)
            (puVar7->_M_t).
            super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
            .
            super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>
            ._M_head_impl;
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_b0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_50._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_b0,
               (FieldDescriptor **)&local_50);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    if (*(int *)(field + 0x3c) == 3) {
      uVar5 = Reflection::GetRepeatedInt32(reflection,message,field,index);
    }
    else {
      uVar5 = Reflection::GetInt32(reflection,message,field);
    }
    (**(code **)(*(long *)&p_Var12->_M_color + 0x18))(p_Var12,(ulong)uVar5,generator);
    break;
  case 2:
    if (*(int *)(field + 0x3c) == 3) {
      iVar9 = Reflection::GetRepeatedInt64(reflection,message,field,index);
    }
    else {
      iVar9 = Reflection::GetInt64(reflection,message,field);
    }
    (**(code **)(*(long *)&p_Var12->_M_color + 0x28))(p_Var12,iVar9,generator);
    break;
  case 3:
    if (*(int *)(field + 0x3c) == 3) {
      uVar5 = Reflection::GetRepeatedUInt32(reflection,message,field,index);
    }
    else {
      uVar5 = Reflection::GetUInt32(reflection,message,field);
    }
    (**(code **)(*(long *)&p_Var12->_M_color + 0x20))(p_Var12,(ulong)uVar5,generator);
    break;
  case 4:
    if (*(int *)(field + 0x3c) == 3) {
      uVar8 = Reflection::GetRepeatedUInt64(reflection,message,field,index);
    }
    else {
      uVar8 = Reflection::GetUInt64(reflection,message,field);
    }
    (**(code **)(*(long *)&p_Var12->_M_color + 0x30))(p_Var12,uVar8,generator);
    break;
  case 5:
    if (*(int *)(field + 0x3c) == 3) {
      dVar3 = Reflection::GetRepeatedDouble(reflection,message,field,index);
      uVar14 = SUB84(dVar3,0);
    }
    else {
      dVar3 = Reflection::GetDouble(reflection,message,field);
      uVar14 = SUB84(dVar3,0);
    }
    (**(code **)(*(long *)&p_Var12->_M_color + 0x40))(uVar14,p_Var12,generator);
    break;
  case 6:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::GetRepeatedFloat(reflection,message,field,index);
    }
    else {
      Reflection::GetFloat(reflection,message,field);
    }
    (**(code **)(*(long *)&p_Var12->_M_color + 0x38))(p_Var12,generator);
    break;
  case 7:
    if (*(int *)(field + 0x3c) == 3) {
      bVar4 = Reflection::GetRepeatedBool(reflection,message,field,index);
    }
    else {
      bVar4 = Reflection::GetBool(reflection,message,field);
    }
    (**(code **)(*(long *)&p_Var12->_M_color + 0x10))(p_Var12,(ulong)bVar4,generator);
    break;
  case 8:
    if (*(int *)(field + 0x3c) == 3) {
      uVar5 = Reflection::GetRepeatedEnumValue(reflection,message,field,index);
    }
    else {
      uVar5 = Reflection::GetEnumValue(reflection,message,field);
    }
    this_01 = FieldDescriptor::enum_type(field);
    pEVar10 = EnumDescriptor::FindValueByNumber(this_01,uVar5);
    if (pEVar10 != (EnumValueDescriptor *)0x0) {
      (**(code **)(*(long *)&p_Var12->_M_color + 0x58))
                (p_Var12,(ulong)uVar5,*(undefined8 *)pEVar10,generator);
      return;
    }
    StringPrintf_abi_cxx11_(&local_b0,"%d",(ulong)uVar5);
    (**(code **)(*(long *)&p_Var12->_M_color + 0x58))(p_Var12,(ulong)uVar5,&local_b0,generator);
    goto LAB_0037327b;
  case 9:
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    if (*(int *)(field + 0x3c) == 3) {
      this_00 = Reflection::GetRepeatedStringReference(reflection,message,field,index,&local_b0);
    }
    else {
      this_00 = Reflection::GetStringReference(reflection,message,field,&local_b0);
    }
    paVar2 = &local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar2;
    if ((0 < this->truncate_string_field_longer_than_) &&
       ((ulong)this->truncate_string_field_longer_than_ < this_00->_M_string_length)) {
      std::__cxx11::string::substr((ulong)local_90,(ulong)this_00);
      plVar11 = (long *)std::__cxx11::string::append((char *)local_90);
      p_Var13 = (_func_void_FieldDescriptor_ptr *)(plVar11 + 2);
      if ((_func_void_FieldDescriptor_ptr *)*plVar11 == p_Var13) {
        local_60 = *(long *)p_Var13;
        lStack_58 = plVar11[3];
        local_70 = (_func_void_FieldDescriptor_ptr *)&local_60;
      }
      else {
        local_60 = *(long *)p_Var13;
        local_70 = (_func_void_FieldDescriptor_ptr *)*plVar11;
      }
      local_68 = plVar11[1];
      *plVar11 = (long)p_Var13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      this_00 = &local_50;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
      if (local_70 != (_func_void_FieldDescriptor_ptr *)&local_60) {
        operator_delete(local_70);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
    }
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_70 = FieldDescriptor::TypeOnceInit;
      local_90[0] = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_70,local_90);
    }
    (**(code **)(*(long *)&p_Var12->_M_color + ((ulong)(*(int *)(field + 0x38) != 9) + 9) * 8))
              (p_Var12,this_00,generator);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
LAB_0037327b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    break;
  case 10:
    if (*(int *)(field + 0x3c) == 3) {
      message_00 = Reflection::GetRepeatedMessage(reflection,message,field,index);
    }
    else {
      message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
    }
    Print(this,message_00,generator);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          TextGenerator* generator) const {
  GOOGLE_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          truncate_string_field_longer_than_ < value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        GOOGLE_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, enum_desc->name(), generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, StringPrintf("%d", enum_value),
                           generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}